

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Read<double> __thiscall
Omega_h::interleave<double>
          (Omega_h *this,
          vector<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_> *arrays)

{
  int *piVar1;
  pointer pRVar2;
  Alloc *pAVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  pointer pRVar6;
  void *in_RDX;
  ulong uVar7;
  ulong uVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  long lVar9;
  int n;
  size_t sVar10;
  bool bVar11;
  bool bVar12;
  Read<double> RVar13;
  Write<double> out;
  type f;
  value_type array;
  uint local_b0;
  Write<double> local_a8;
  undefined1 local_90 [16];
  Alloc local_80;
  void *local_38;
  
  pRVar6 = (arrays->
           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (arrays->
           super__Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 == pRVar2) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    uVar7 = (long)pRVar2 - (long)pRVar6;
    pAVar3 = (pRVar6->write_).shared_alloc_.alloc;
    if (((ulong)pAVar3 & 1) == 0) {
      sVar10 = pAVar3->size;
    }
    else {
      sVar10 = (ulong)pAVar3 >> 3;
    }
    do {
      pAVar3 = (pRVar6->write_).shared_alloc_.alloc;
      if (((ulong)pAVar3 & 1) == 0) {
        uVar8 = pAVar3->size;
      }
      else {
        uVar8 = (ulong)pAVar3 >> 3;
      }
      n = (int)(sVar10 >> 3);
      local_80.prev = (Alloc *)arrays;
      if ((int)(uVar8 >> 3) != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar2);
    local_90._0_8_ = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
    local_b0 = (uint)(uVar7 >> 4);
    Write<double>::Write(&local_a8,n * local_b0,(string *)local_90);
    local_80.ptr = this;
    if ((Alloc *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_,
                      CONCAT44(local_80.size._4_4_,(undefined4)local_80.size) + 1);
    }
    if (0 < (int)local_b0) {
      local_80._48_8_ = ZEXT48(local_b0 & 0x7fffffff);
      lVar9 = 8;
      uVar7 = 0;
      do {
        pRVar6 = (((_Vector_base<Omega_h::Read<double>,_std::allocator<Omega_h::Read<double>_>_> *)
                  &(local_80.prev)->size)->_M_impl).super__Vector_impl_data._M_start;
        local_80.next = *(Alloc **)((long)pRVar6 + lVar9 + -8);
        if (((ulong)local_80.next & 7) == 0 && local_80.next != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_80.next = (Alloc *)((local_80.next)->size * 8 + 1);
          }
          else {
            (local_80.next)->use_count = (local_80.next)->use_count + 1;
          }
        }
        pAVar3 = local_80.next;
        local_80.name._M_string_length =
             *(size_type *)((long)&(pRVar6->write_).shared_alloc_.alloc + lVar9);
        local_90._0_8_ = local_a8.shared_alloc_.alloc;
        if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
            local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_90._0_8_ = (local_a8.shared_alloc_.alloc)->size * 8 + 1;
          }
          else {
            (local_a8.shared_alloc_.alloc)->use_count =
                 (local_a8.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_90._8_8_ = local_a8.shared_alloc_.direct_ptr;
        local_80.size._4_4_ = (undefined4)uVar7;
        bVar11 = local_80.next != (Alloc *)0x0;
        bVar12 = ((ulong)local_80.next & 7) == 0;
        local_80.name._M_dataplus._M_p = (pointer)local_80.next;
        if (bVar12 && bVar11) {
          if (entering_parallel == '\x01') {
            local_80.name._M_dataplus._M_p = (pointer)((local_80.next)->size * 8 + 1);
          }
          else {
            (local_80.next)->use_count = (local_80.next)->use_count + 1;
          }
        }
        local_80.size._0_4_ = local_b0;
        local_38 = (void *)local_80.name._M_string_length;
        parallel_for<Omega_h::interleave<double>(std::vector<Omega_h::Read<double>,std::allocator<Omega_h::Read<double>>>)::_lambda(int)_1_>
                  (n,(type *)local_90,"interleave");
        _Var5._M_p = local_80.name._M_dataplus._M_p;
        if (((ulong)local_80.name._M_dataplus._M_p & 7) == 0 &&
            (Alloc *)local_80.name._M_dataplus._M_p != (Alloc *)0x0) {
          piVar1 = (int *)((long)local_80.name._M_dataplus._M_p + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_80.name._M_dataplus._M_p);
            operator_delete(_Var5._M_p,0x48);
          }
        }
        uVar4 = local_90._0_8_;
        if ((local_90._0_8_ & 7) == 0 && (Alloc *)local_90._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_90._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_90._0_8_);
            operator_delete((void *)uVar4,0x48);
          }
        }
        if (bVar12 && bVar11) {
          piVar1 = &pAVar3->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar3);
            operator_delete(pAVar3,0x48);
          }
        }
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 0x10;
      } while (local_80._48_8_ != uVar7);
    }
    this = (Omega_h *)local_80.ptr;
    local_80.name.field_2._M_allocated_capacity = (size_type)local_a8.shared_alloc_.alloc;
    local_80.name.field_2._8_8_ = local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_80.name.field_2._M_allocated_capacity = (local_a8.shared_alloc_.alloc)->size * 8 + 1;
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)local_80.ptr,(Write<double> *)&local_80.name.field_2);
    uVar4 = local_80.name.field_2._M_allocated_capacity;
    in_RDX = extraout_RDX;
    if ((local_80.name.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_80.name.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_80.name.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_80.name.field_2._M_allocated_capacity);
        operator_delete((void *)uVar4,0x48);
        in_RDX = extraout_RDX_00;
      }
    }
    pAVar3 = local_a8.shared_alloc_.alloc;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        in_RDX = extraout_RDX_01;
      }
    }
  }
  RVar13.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar13.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}